

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O3

PmError Pm_WriteSysEx(PortMidiStream *stream,PmTimestamp when,uchar *msg)

{
  byte bVar1;
  PmError PVar2;
  int length;
  int iVar3;
  int iVar4;
  int32_t length_00;
  uint uVar5;
  long lVar6;
  PmEvent local_828 [257];
  
  uVar5 = (uint)*msg;
  local_828[0].message = (PmMessage)*msg;
  length_00 = 1;
  local_828[0].timestamp = when;
  if (local_828[0].message != 0xf7) {
    iVar4 = 0;
    length = 1;
    iVar3 = 8;
    do {
      msg = msg + 1;
      if (iVar3 == 0x20) {
        iVar4 = iVar4 + 1;
        if (iVar4 == length) {
          PVar2 = Pm_Write(stream,local_828,length);
          if (PVar2 != pmNoData) {
            return PVar2;
          }
          iVar4 = 0;
          if (*(long *)((long)stream + 0x60) == 0) {
            length = 0x100;
          }
          else {
            while( true ) {
              uVar5 = **(uint **)((long)stream + 0x68);
              if (*(uint *)((long)stream + 0x70) <= uVar5) break;
              bVar1 = *msg;
              lVar6 = *(long *)((long)stream + 0x60);
              **(uint **)((long)stream + 0x68) = uVar5 + 1;
              *(byte *)(lVar6 + (ulong)uVar5) = bVar1;
              bVar1 = *msg;
              msg = msg + 1;
              if (bVar1 == 0xf7) {
                PVar2 = (**(code **)(*(long *)((long)stream + 0x50) + 0x10))(stream,0);
                *(undefined4 *)((long)stream + 0x2c) = 0;
                if (PVar2 == pmNoData) {
                  return pmNoData;
                }
                if (PVar2 == pmHostError) {
                  (**(code **)(*(long *)((long)stream + 0x50) + 0x60))
                            (stream,pm_hosterror_text,0x100);
                  pm_hosterror = 1;
                  return pmHostError;
                }
                return PVar2;
              }
            }
            length = 1;
          }
        }
        lVar6 = (long)iVar4;
        local_828[lVar6].message = 0;
        local_828[lVar6].timestamp = when;
        uVar5 = 0;
        iVar3 = 0;
      }
      else {
        lVar6 = (long)iVar4;
      }
      uVar5 = uVar5 | (uint)*msg << ((byte)iVar3 & 0x1f);
      local_828[lVar6].message = uVar5;
      iVar3 = iVar3 + 8;
    } while (*msg != 0xf7);
    length_00 = iVar4 + (uint)(iVar3 != 0);
    if (length_00 == 0) {
      return pmNoData;
    }
  }
  PVar2 = Pm_Write(stream,local_828,length_00);
  if (PVar2 == pmNoData) {
    return pmNoData;
  }
  return PVar2;
}

Assistant:

PMEXPORT PmError Pm_WriteSysEx(PortMidiStream *stream, PmTimestamp when, 
                      unsigned char *msg)
{
    /* allocate buffer space for PM_DEFAULT_SYSEX_BUFFER_SIZE bytes */
    /* each PmEvent holds sizeof(PmMessage) bytes of sysex data */
    #define BUFLEN ((int) (PM_DEFAULT_SYSEX_BUFFER_SIZE / sizeof(PmMessage)))
    PmEvent buffer[BUFLEN];
    int buffer_size = 1; /* first time, send 1. After that, it's BUFLEN */
    PmInternal *midi = (PmInternal *) stream;
    /* the next byte in the buffer is represented by an index, bufx, and
       a shift in bits */
    int shift = 0;
    int bufx = 0;
    buffer[0].message = 0;
    buffer[0].timestamp = when;

    while (1) {
        /* insert next byte into buffer */
        buffer[bufx].message |= ((*msg) << shift);
        shift += 8;
        if (*msg++ == MIDI_EOX) break;
        if (shift == 32) {
            shift = 0;
            bufx++;
            if (bufx == buffer_size) {
                PmError err = Pm_Write(stream, buffer, buffer_size);
                /* note: Pm_Write has already called errmsg() */
                if (err) return err;
                /* prepare to fill another buffer */
                bufx = 0;
                buffer_size = BUFLEN;
                /* optimization: maybe we can just copy bytes */
                if (midi->fill_base) {
                    PmError err;
                    while (*(midi->fill_offset_ptr) < midi->fill_length) {
                        midi->fill_base[(*midi->fill_offset_ptr)++] = *msg;
                        if (*msg++ == MIDI_EOX) {
                            err = pm_end_sysex(midi);
                            if (err != pmNoError) return pm_errmsg(err);
                            goto end_of_sysex;
                        }
                    }
                    /* I thought that I could do a pm_Write here and
                     * change this if to a loop, avoiding calls in Pm_Write
                     * to the slower write_byte, but since 
                     * sysex_in_progress is true, this will not flush
                     * the buffer, and we'll infinite loop: */
                    /* err = Pm_Write(stream, buffer, 0);
                       if (err) return err; */
                    /* instead, the way this works is that Pm_Write calls
                     * write_byte on 4 bytes. The first, since the buffer
                     * is full, will flush the buffer and allocate a new
                     * one. This primes the buffer so
                     * that we can return to the loop above and fill it
                     * efficiently without a lot of function calls.
                     */
                    buffer_size = 1; /* get another message started */
                }
            }
            buffer[bufx].message = 0;
            buffer[bufx].timestamp = when;
        } 
        /* keep inserting bytes until you find MIDI_EOX */
    }
end_of_sysex:
    /* we're finished sending full buffers, but there may
     * be a partial one left.
     */
    if (shift != 0) bufx++; /* add partial message to buffer len */
    if (bufx) { /* bufx is number of PmEvents to send from buffer */
        PmError err = Pm_Write(stream, buffer, bufx);
        if (err) return err;
    }
    return pmNoError;
}